

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O1

void __thiscall Hpipe::InstructionGraph::make_init(InstructionGraph *this)

{
  PendingTrans *pPVar1;
  uint index;
  Instruction *pIVar2;
  undefined8 uVar3;
  Instruction *pIVar4;
  CharItem *pCVar5;
  PendingTrans *pt;
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  *p_Var6;
  PendingTrans *__args;
  _Elt_pointer pt_00;
  _Map_pointer ppPVar7;
  deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> pending_rewinds;
  InstructionRewind *rw_1;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  pending_trans_mark;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  loc_pending_trans;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  pending_trans;
  _Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> local_268;
  Transition local_210;
  InstructionGraph *local_1e8;
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  *local_1e0;
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  local_1d8;
  undefined1 local_188 [56];
  _Elt_pointer pPStack_150;
  _Elt_pointer local_148;
  _Base_ptr p_Stack_140;
  pointer local_118;
  pointer local_108;
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  local_f8;
  Context local_a0;
  
  local_268._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_268._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
  _M_initialize_map(&local_268,0);
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (PendingTrans *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (PendingTrans *)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::_M_initialize_map(&local_f8,0);
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (PendingTrans *)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (PendingTrans *)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::_M_initialize_map(&local_1d8,0);
  pIVar4 = (Instruction *)operator_new(0x178);
  pCVar5 = CharGraph::root(this->cg);
  Context::Context(&local_a0,pCVar5,1);
  Instruction::Instruction(pIVar4,&local_a0);
  pIVar4->_vptr_Instruction = (_func_int **)&PTR__Instruction_0019a988;
  pIVar4 = &PtrPool<Hpipe::Instruction,32>::operator<<
                      ((PtrPool<Hpipe::Instruction,32> *)&this->inst_pool,(InstructionSkip *)pIVar4)
            ->super_Instruction;
  this->init = pIVar4;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree(&local_a0.paths_to_strings._M_t);
  if (local_a0.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.paths_to_mark.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                    .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.paths_to_mark.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0.pos.super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
      super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.pos.
                    super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                    super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.pos.
                          super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          .
                          super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_210.inst = (Instruction *)((ulong)local_210.inst._4_4_ << 0x20);
  pIVar4 = this->init;
  pCVar5 = CharGraph::root(this->cg);
  Context::forward((PC *)local_188,&pIVar4->cx,pCVar5,this->never_ending);
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
  ::emplace_back<Hpipe::Instruction*&,int,std::pair<Hpipe::Context,Hpipe::Vec<unsigned_int>>>
            ((deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
              *)&local_f8,&this->init,(int *)&local_210,
             (pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)local_188);
  if (local_118 != (pointer)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
               *)&pPStack_150);
  if ((PendingTrans *)local_188._32_8_ != (PendingTrans *)0x0) {
    operator_delete((void *)local_188._32_8_,local_188._48_8_ - local_188._32_8_);
  }
  local_1e8 = this;
  if ((InstructionRewind *)local_188._0_8_ != (InstructionRewind *)0x0) {
    operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
  }
  while( true ) {
    if (((((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
          -0x79435e50d79435e5 +
          (((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_node -
            (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(local_f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
          3 == ((long)local_f8._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
               0x79435e50d79435e5) &&
        (((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
          (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
         -0x79435e50d79435e5 +
         (((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
         (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
         3 == ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
              0x79435e50d79435e5)) &&
       (((long)local_268._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
        ((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)local_268._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
        ((((ulong)((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_node -
                  (long)local_268._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(local_268._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
        0x40 == 0)) break;
    if ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
         local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) &&
       (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
      while (((long)local_268._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_268._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_268._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)local_268._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_268._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_268._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 0x40 != 0) {
        local_188._0_8_ = *local_268._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_268._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_268._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_268._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_268._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_268._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_268._M_impl.super__Deque_impl_data._M_start._M_last =
               local_268._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_268._M_impl.super__Deque_impl_data._M_start._M_first =
               local_268._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_268._M_impl.super__Deque_impl_data._M_start._M_node =
               local_268._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_268._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_268._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        make_rewind_data(this,(InstructionRewind *)local_188._0_8_);
        local_210.inst = (Instruction *)((ulong)local_210.inst & 0xffffffff00000000);
        std::
        deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
        ::
        emplace_back<Hpipe::InstructionRewind*&,int,std::pair<Hpipe::Context,Hpipe::Vec<unsigned_int>>&>
                  ((deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
                    *)&local_f8,(InstructionRewind **)local_188,(int *)&local_210,
                   (PC *)(local_188._0_8_ + 0x1d0));
      }
    }
    else {
      p_Var6 = &local_1d8;
      pt_00 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
          -0x79435e50d79435e5 +
          (((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
            (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
          * 3 == ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                 0x79435e50d79435e5) {
        p_Var6 = &local_f8;
        pt_00 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
      }
      local_148 = (_Elt_pointer)0x0;
      p_Stack_140 = (_Base_ptr)0x0;
      local_188._48_8_ = (PendingTrans *)0x0;
      pPStack_150 = (_Elt_pointer)0x0;
      local_188._32_8_ = (PendingTrans *)0x0;
      local_188._40_8_ = (_Map_pointer)0x0;
      local_188._16_8_ = (PendingTrans *)0x0;
      local_188._24_8_ = (InstructionMark *)0x0;
      local_188._0_8_ = (InstructionRewind *)0x0;
      local_188._8_8_ = (pointer)0x0;
      std::
      _Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::_M_initialize_map((_Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                           *)local_188,0);
      local_1e0 = p_Var6;
      pIVar4 = make_transitions(this,(deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                                      *)local_188,pt_00,&pt_00->cx);
      uVar3 = local_188._48_8_;
      __args = (PendingTrans *)local_188._16_8_;
      pPVar1 = (PendingTrans *)local_188._32_8_;
      ppPVar7 = (_Map_pointer)local_188._40_8_;
      while (__args != (PendingTrans *)uVar3) {
        p_Var6 = &local_f8;
        if ((__args->cx).mark != (InstructionMark *)0x0) {
          p_Var6 = &local_1d8;
        }
        std::
        deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
        ::emplace_back<Hpipe::InstructionGraph::PendingTrans>
                  ((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                    *)p_Var6,__args);
        __args = __args + 1;
        if (__args == pPVar1) {
          __args = ppPVar7[1];
          ppPVar7 = ppPVar7 + 1;
          pPVar1 = __args + 3;
        }
      }
      if (pIVar4 == (Instruction *)0x0) {
        local_210.inst = (Instruction *)0x0;
      }
      else {
        local_210.inst =
             (Instruction *)
             __dynamic_cast(pIVar4,&Instruction::typeinfo,&InstructionRewind::typeinfo,0);
      }
      if ((InstructionRewind *)local_210.inst != (InstructionRewind *)0x0) {
        if (local_268._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_268._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<Hpipe::InstructionRewind*,std::allocator<Hpipe::InstructionRewind*>>::
          _M_push_back_aux<Hpipe::InstructionRewind*const&>
                    ((deque<Hpipe::InstructionRewind*,std::allocator<Hpipe::InstructionRewind*>> *)
                     &local_268,(InstructionRewind **)&local_210);
        }
        else {
          *local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (InstructionRewind *)local_210.inst;
          local_268._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_268._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      pIVar2 = pt_00->inst;
      index = pt_00->num_edge;
      Transition::Transition(&local_210,pIVar4,&pt_00->rcitem,-1.0);
      Vec<Hpipe::Transition>::secure_set(&pIVar2->next,index,&local_210);
      this = local_1e8;
      if (local_210.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_210.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.rcitem.
                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Instruction*&,Hpipe::Vec<unsigned_int>&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar4->prev,
                 &pt_00->inst,&pt_00->rcitem);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::pop_front((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                   *)local_1e0);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::~deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                *)local_188);
    }
  }
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::~deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
            *)&local_1d8);
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::~deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
            *)&local_f8);
  std::_Deque_base<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
  ~_Deque_base(&local_268);
  return;
}

Assistant:

void InstructionGraph::make_init() {
    // as much as possible, we try to move forward without cycles (to avoid miss of possible "free mark")
    std::deque<InstructionRewind *> pending_rewinds;
    std::deque<PendingTrans> pending_trans, pending_trans_mark;
    init = inst_pool << new InstructionSkip( Context( cg->root(), Context::FL_BEG ) );

    // first transition
    pending_trans.emplace_back( init, 0, init->cx.forward( cg->root(), never_ending ) );

    // make all the remaining transitions
    while ( pending_trans.size() || pending_trans_mark.size() || pending_rewinds.size() ) {
        // if only rewinds => make rewind data (exec, ncx, ...) and add the new transitions
        if ( pending_trans.empty() && pending_trans_mark.empty() ) {
            while ( pending_rewinds.size() ) {
                InstructionRewind *rw = pending_rewinds.front();
                pending_rewinds.pop_front();
                make_rewind_data( rw );

                pending_trans.emplace_back( rw, 0, rw->ncx );
            }
            continue;
        }

        //
        std::deque<PendingTrans> &pt_list = pending_trans_mark.size() ? pending_trans_mark : pending_trans;
        PendingTrans &pt = pt_list.front();

        // make instruction with associated new pending transitions
        std::deque<PendingTrans> loc_pending_trans;
        Instruction *inst = make_transitions( loc_pending_trans, pt );
        for( PendingTrans &pt : loc_pending_trans )
            ( pt.cx.mark ? pending_trans_mark : pending_trans ).push_back( std::move( pt ) );
        if ( InstructionRewind *rw = dynamic_cast<InstructionRewind *>( inst ) )
            pending_rewinds.push_back( rw );

        // insert it into the graph
        pt.inst->next.secure_set( pt.num_edge, { inst, pt.rcitem } );
        inst->prev.emplace_back( pt.inst, pt.rcitem );

        //
        pt_list.pop_front();
    }
}